

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdOutput.hpp
# Opt level: O2

void __thiscall imgtogb::StdOutput::version(StdOutput *this,CmdLineInterface *_cmd)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&this->basename);
  poVar2 = std::operator<<(poVar2," ");
  iVar1 = (*_cmd->_vptr_CmdLineInterface[9])(_cmd);
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  poVar2 = std::operator<<((ostream *)&std::cout,"Written by ");
  poVar2 = std::operator<<(poVar2,(string *)&this->author);
  std::endl<char,std::char_traits<char>>(poVar2);
  return;
}

Assistant:

inline void StdOutput::version(TCLAP::CmdLineInterface& _cmd) {
		std::cout << basename << " " << _cmd.getVersion() << std::endl << std::endl;
		std::cout << "Written by " << author << std::endl;
	}